

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coord.cpp
# Opt level: O3

ostream * despot::operator<<(ostream *os,Coord *coord)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"(",1);
  poVar1 = (ostream *)std::ostream::operator<<(os,coord->x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,coord->y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  return os;
}

Assistant:

ostream& operator<<(ostream& os, const Coord& coord) {
	os << "(" << coord.x << ", " << coord.y << ")";
	return os;
}